

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall xemmai::ast::t_block::f_use(t_block *this,size_t a_i,bool a_put)

{
  size_type sVar1;
  reference pvVar2;
  value_type *x;
  bool a_put_local;
  size_t a_i_local;
  t_block *this_local;
  
  sVar1 = std::
          vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
          ::size(&this->v_privates);
  if (sVar1 < a_i + 1) {
    std::vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>::
    resize(&this->v_privates,a_i + 1);
  }
  pvVar2 = std::
           vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
           ::operator[](&this->v_privates,a_i);
  if ((pvVar2->v_out & 1U) == 0) {
    pvVar2->v_out = true;
    pvVar2->v_define = a_put;
    pvVar2->v_use = (bool)((a_put ^ 0xffU) & 1);
  }
  return;
}

Assistant:

void f_use(size_t a_i, bool a_put)
	{
		if (v_privates.size() < a_i + 1) v_privates.resize(a_i + 1);
		auto& x = v_privates[a_i];
		if (x.v_out) return;
		x.v_out = true;
		x.v_define = a_put;
		x.v_use = !a_put;
	}